

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O0

uint load_create_object(mmt_nvidia_create_object **create_,uint pfx)

{
  uint sz;
  void *pvVar1;
  mmt_nvidia_create_object *pmVar2;
  mmt_nvidia_create_object *create;
  uint size;
  uint pfx_local;
  mmt_nvidia_create_object **create__local;
  
  pvVar1 = mmt_load_data_with_prefix(0x13,pfx,0);
  mmt_buf_check_sanity((mmt_buf *)((long)pvVar1 + 0xe));
  sz = *(int *)((long)pvVar1 + 0xe) + 0x13;
  pmVar2 = (mmt_nvidia_create_object *)mmt_load_data_with_prefix(sz,pfx,0);
  mmt_check_eor(sz + pfx);
  if (create_ != (mmt_nvidia_create_object **)0x0) {
    *create_ = pmVar2;
  }
  return sz;
}

Assistant:

static unsigned int load_create_object(struct mmt_nvidia_create_object **create_, unsigned int pfx)
{
	unsigned int size = sizeof(struct mmt_nvidia_create_object) + 1;
	struct mmt_nvidia_create_object *create;
	create = mmt_load_data_with_prefix(size, pfx, 0);
	mmt_buf_check_sanity(&create->name);
	size += create->name.len;
	create = mmt_load_data_with_prefix(size, pfx, 0);

	mmt_check_eor(size + pfx);

	if (create_)
		*create_ = create;
	return size;
}